

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoostTestApprovals.h
# Opt level: O1

void __thiscall
ApprovalTests::BoostApprovalListener::test_unit_start(BoostApprovalListener *this,test_unit *test)

{
  TestName *this_00;
  string path;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,(test->p_file_name).m_begin,(test->p_file_name).m_end);
  this_00 = &this->currentTest;
  TestName::setFileName(this_00,&local_40);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this_00->sections,(value_type *)&test->p_name);
  FrameworkIntegrations::setCurrentTest(this_00);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/boost_test/BoostTestApprovals.h:24:17)>
             ::_M_invoke;
  local_58 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/boost_test/BoostTestApprovals.h:24:17)>
             ::_M_manager;
  FrameworkIntegrations::setTestPassedNotification((TestPassedNotification *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void test_unit_start(boost::unit_test::test_unit const& test) override
        {
            std::string path(test.p_file_name.begin(), test.p_file_name.end());
            currentTest.setFileName(path);

            currentTest.sections.push_back(test.p_name);
            ApprovalTests::FrameworkIntegrations::setCurrentTest(&currentTest);
            ApprovalTests::FrameworkIntegrations::setTestPassedNotification(
                []() { BOOST_CHECK(true); });
        }